

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logic_program_types.cpp
# Opt level: O3

void __thiscall
Clasp::Asp::SccChecker::SccChecker
          (SccChecker *this,LogicProgram *prg,AtomList *sccAtoms,uint32 startScc)

{
  uint uVar1;
  ulong uVar2;
  
  (this->nodeStack_).ebo_.buf = (pointer)0x0;
  (this->nodeStack_).ebo_.size = 0;
  (this->nodeStack_).ebo_.cap = 0;
  (this->callStack_).ebo_.buf = (pointer)0x0;
  (this->callStack_).ebo_.size = 0;
  (this->callStack_).ebo_.cap = 0;
  this->prg_ = prg;
  this->sccAtoms_ = sccAtoms;
  this->count_ = 0;
  this->sccs_ = startScc;
  if ((prg->atoms_).ebo_.size != 1) {
    uVar2 = 0xffffffff;
    do {
      uVar1 = (int)uVar2 + 1;
      uVar2 = (ulong)uVar1;
      visitDfs(this,(PrgNode *)(prg->atoms_).ebo_.buf[uVar2],Atom);
    } while (uVar1 != (prg->atoms_).ebo_.size - 2);
  }
  if ((prg->bodies_).ebo_.size != 0) {
    uVar2 = 0;
    do {
      visitDfs(this,&(prg->bodies_).ebo_.buf[uVar2]->super_PrgNode,Body);
      uVar1 = (int)uVar2 + 1;
      uVar2 = (ulong)uVar1;
    } while (uVar1 != (prg->bodies_).ebo_.size);
  }
  return;
}

Assistant:

SccChecker::SccChecker(LogicProgram& prg, AtomList& sccAtoms, uint32 startScc)
	: prg_(&prg), sccAtoms_(&sccAtoms), count_(0), sccs_(startScc) {
	for (uint32 i = 0; i != prg.numAtoms(); ++i) {
		visit(prg.getAtom(i));
	}
	for (uint32 i = 0; i != prg.numBodies(); ++i) {
		visit(prg.getBody(i));
	}
}